

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O3

shared_ptr<Label> __thiscall
SymbolTable::getLabel(SymbolTable *this,Identifier *symbol,int file,int section)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  size_type sVar4;
  int iVar5;
  bool bVar6;
  int *piVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  long lVar10;
  undefined4 in_register_00000014;
  Identifier *symbol_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  int in_R8D;
  shared_ptr<Label> sVar12;
  SymbolKey key;
  int local_8c;
  int local_88;
  undefined1 local_81;
  size_type local_80;
  Identifier local_78;
  SymbolKey local_58;
  
  symbol_00 = (Identifier *)CONCAT44(in_register_00000014,file);
  local_8c = in_R8D;
  local_88 = section;
  bVar6 = isValidSymbolName(symbol_00);
  if (bVar6) {
    pcVar2 = (symbol_00->_name)._M_dataplus._M_p;
    if (*pcVar2 == '@') {
      piVar7 = &local_8c;
      if (pcVar2[1] == '@') {
        piVar7 = &local_88;
      }
    }
    else {
      local_8c = -1;
      piVar7 = &local_88;
    }
    *piVar7 = -1;
    iVar5 = local_8c;
    SymbolKey::SymbolKey(&local_58,symbol_00,local_88,local_8c);
    iVar8 = std::
            _Rb_tree<SymbolKey,_std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>,_std::_Select1st<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
            ::find((_Rb_tree<SymbolKey,_std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>,_std::_Select1st<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
                    *)symbol,&local_58);
    if (iVar8._M_node == (_Base_ptr)&(symbol->_name)._M_string_length) {
      local_80 = symbol[1]._name.field_2._M_allocated_capacity;
      lVar10 = *(long *)((long)&symbol[1]._name.field_2 + 8);
      pmVar9 = std::
               map<SymbolKey,_SymbolTable::SymbolInfo,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
               ::operator[]((map<SymbolKey,_SymbolTable::SymbolInfo,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
                             *)symbol,&local_58);
      pmVar9->type = LabelSymbol;
      pmVar9->index = (long)(lVar10 - local_80) >> 4;
      paVar1 = &local_78._name.field_2;
      pcVar3 = (symbol_00->_name)._M_dataplus._M_p;
      local_78._name._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar3,pcVar3 + (symbol_00->_name)._M_string_length);
      *(undefined8 *)&(this->symbols)._M_t._M_impl = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Label,std::allocator<Label>,Identifier>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &(this->symbols)._M_t._M_impl.super__Rb_tree_header,(Label **)this,
                 (allocator<Label> *)&local_81,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._name._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._name._M_dataplus._M_p,
                        local_78._name.field_2._M_allocated_capacity + 1);
      }
      *(uint *)(*(long *)&(this->symbols)._M_t._M_impl + 0x58) = (uint)(iVar5 != in_R8D) + in_R8D;
      std::vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>::push_back
                ((vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_> *)
                 &symbol[1]._name.field_2,(value_type *)this);
      _Var11._M_pi = extraout_RDX_01;
    }
    else if (*(int *)&iVar8._M_node[2]._M_parent == 0) {
      sVar4 = symbol[1]._name.field_2._M_allocated_capacity;
      lVar10 = (long)iVar8._M_node[2]._M_left * 0x10;
      _Var11._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(sVar4 + lVar10);
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->symbols)._M_t._M_impl = _Var11._M_pi
      ;
      lVar10 = *(long *)(sVar4 + 8 + lVar10);
      *(long *)&(this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header = lVar10;
      if (lVar10 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(lVar10 + 8) = *(int *)(lVar10 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(lVar10 + 8) = *(int *)(lVar10 + 8) + 1;
        }
      }
    }
    else {
      *(undefined8 *)&(this->symbols)._M_t._M_impl = 0;
      *(undefined8 *)&(this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
      _Var11._M_pi = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.name._M_dataplus._M_p != &local_58.name.field_2) {
      operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1
                     );
      _Var11._M_pi = extraout_RDX_02;
    }
  }
  else {
    *(undefined8 *)&(this->symbols)._M_t._M_impl = 0;
    *(undefined8 *)&(this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    _Var11._M_pi = extraout_RDX;
  }
  sVar12.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var11._M_pi;
  sVar12.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Label>)sVar12.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Label> SymbolTable::getLabel(const Identifier& symbol, int file, int section)
{
	if (!isValidSymbolName(symbol))
		return nullptr;

	int actualSection = section;
	setFileSectionValues(symbol,file,section);
	SymbolKey key = { symbol, file, section };

	// find label, create new one if it doesn't exist
	auto it = symbols.find(key);
	if (it == symbols.end())
	{
		SymbolInfo value = { LabelSymbol, labels.size() };
		symbols[key] = value;
		
		std::shared_ptr<Label> result = std::make_shared<Label>(Identifier(symbol));
		if (section == actualSection)
			result->setSection(section);			// local, set section of parent
		else
			result->setSection(actualSection+1);	// global, set section of children
		labels.push_back(result);
		return result;
	}

	// make sure not to match symbols that aren't labels
	if (it->second.type != LabelSymbol)
		return nullptr;

	return labels[it->second.index];
}